

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2EndElement(void *ctx,xmlChar *name)

{
  uint uVar1;
  xmlParserCtxtPtr ctxt;
  xmlChar *name_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    if ((((*(int *)((long)ctx + 0x34) == 0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
        (*(int *)((long)ctx + 0x18) != 0)) &&
       ((*(long *)((long)ctx + 0x10) != 0 && (*(long *)(*(long *)((long)ctx + 0x10) + 0x50) != 0))))
    {
      uVar1 = xmlValidateOneElement
                        ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),
                         *(xmlNodePtr *)((long)ctx + 0x50));
      *(uint *)((long)ctx + 0x98) = uVar1 & *(uint *)((long)ctx + 0x98);
    }
    *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
    nodePop((xmlParserCtxtPtr)ctx);
  }
  return;
}

Assistant:

void
xmlSAX2EndElement(void *ctx, const xmlChar *name ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctxt == NULL)
        return;

#if defined(LIBXML_SAX1_ENABLED) && defined(LIBXML_VALID_ENABLED)
    if (!ctxt->html && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
        ctxt->valid &= xmlValidateOneElement(&ctxt->vctxt, ctxt->myDoc,
					     ctxt->node);
#endif /* LIBXML_VALID_ENABLED */

#if defined(LIBXML_SAX1_ENABLED) || defined(LIBXML_HTML_ENABLED)
    ctxt->nodemem = -1;

    /*
     * end of parsing of this node.
     */
    nodePop(ctxt);
#endif
}